

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.cpp
# Opt level: O0

Variable __thiscall
LiteScript::_Type_BOOLEAN::OEqual(_Type_BOOLEAN *this,Variable *obj1,Variable *obj2)

{
  bool bVar1;
  bool bVar2;
  Object *pOVar3;
  Type *this_00;
  bool *pbVar4;
  Variable *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar5;
  Variable VVar6;
  Variable *obj2_local;
  Variable *obj1_local;
  _Type_BOOLEAN *this_local;
  Variable *res;
  
  pOVar3 = Variable::operator->(obj2);
  Memory::Create((Memory *)this,(Type *)pOVar3->memory);
  pOVar3 = Variable::operator->(in_RCX);
  this_00 = Object::GetType(pOVar3);
  bVar2 = Type::operator!=(this_00,(Type *)obj1);
  if (bVar2) {
    pOVar3 = Variable::operator->((Variable *)this);
    pbVar4 = Object::GetData<bool>(pOVar3);
    *pbVar4 = false;
    puVar5 = extraout_RDX;
  }
  else {
    pOVar3 = Variable::operator->(obj2);
    pbVar4 = Object::GetData<bool>(pOVar3);
    bVar2 = *pbVar4;
    pOVar3 = Variable::operator->(in_RCX);
    pbVar4 = Object::GetData<bool>(pOVar3);
    bVar1 = *pbVar4;
    pOVar3 = Variable::operator->((Variable *)this);
    pbVar4 = Object::GetData<bool>(pOVar3);
    *pbVar4 = (bVar2 & 1U) == (bVar1 & 1U);
    puVar5 = extraout_RDX_00;
  }
  VVar6.nb_ref = puVar5;
  VVar6.obj = (Object *)this;
  return VVar6;
}

Assistant:

LiteScript::Variable LiteScript::_Type_BOOLEAN::OEqual(const LiteScript::Variable& obj1, const LiteScript::Variable& obj2) const {
    Variable res = obj1->memory.Create(Type::BOOLEAN);
    if (obj2->GetType() != *this)
        res->GetData<bool>() = false;
    else
        res->GetData<bool>() = (obj1->GetData<bool>() == obj2->GetData<bool>());
    return res;
}